

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Token * __thiscall wabt::WastParser::Consume(Token *__return_storage_ptr__,WastParser *this)

{
  optional<wabt::Token> *poVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  char *pcVar9;
  
  bVar2 = (this->tokens_).i;
  if ((this->tokens_).tokens._M_elems[bVar2].super__Optional_base<wabt::Token,_true,_true>.
      _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
    __assert_fail("!tokens_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x29c,"Token wabt::WastParser::Consume()");
  }
  if ((this->tokens_).tokens._M_elems[bVar2].super__Optional_base<wabt::Token,_true,_true>.
      _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged != false) {
    poVar1 = (this->tokens_).tokens._M_elems + bVar2;
    sVar3 = *(size_t *)
             &(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
              super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc;
    pcVar4 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 8
                       );
    aVar5.offset = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                    ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                            super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 0x10
                    ))->field_1).offset;
    uVar6 = *(undefined8 *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 0x18);
    uVar7 = *(undefined8 *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x20);
    sVar8 = *(size_t *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x28);
    pcVar9 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload + 0x38);
    (__return_storage_ptr__->field_2).text_._M_str =
         *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                           super__Optional_payload_base<wabt::Token>._M_payload + 0x30);
    (__return_storage_ptr__->field_2).literal_.text._M_str = pcVar9;
    *(undefined8 *)&__return_storage_ptr__->token_type_ = uVar7;
    (__return_storage_ptr__->field_2).text_._M_len = sVar8;
    (__return_storage_ptr__->loc).field_1.field_1.offset = aVar5.offset;
    *(undefined8 *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = uVar6;
    (__return_storage_ptr__->loc).filename._M_len = sVar3;
    (__return_storage_ptr__->loc).filename._M_str = pcVar4;
    TokenQueue::pop_front(&this->tokens_);
    return __return_storage_ptr__;
  }
  std::__throw_bad_optional_access();
}

Assistant:

bool WastParser::TokenQueue::empty() const {
  return !tokens[i];
}